

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::LoopLayerParams::SharedCtor(LoopLayerParams *this)

{
  string *default_value;
  LoopLayerParams *this_local;
  
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->conditionvar_,default_value);
  memset(&this->conditionnetwork_,0,0x18);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void LoopLayerParams::SharedCtor() {
  conditionvar_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&conditionnetwork_, 0, reinterpret_cast<char*>(&maxloopiterations_) -
    reinterpret_cast<char*>(&conditionnetwork_) + sizeof(maxloopiterations_));
  _cached_size_ = 0;
}